

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

Gia_Man_t * Gia_ManGenerateExtraAig(int nBoxes,int nIns,int nOuts)

{
  int iVar1;
  int iLit1;
  Gia_Man_t *p;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int pInLits [16];
  int pOutLits [16];
  int local_b8 [16];
  int local_78 [18];
  
  p = Gia_ManStart(nBoxes * 0x14);
  if ((nIns < 0x10) && (nOuts < 0x10)) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)nIns;
    if (nIns < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = Gia_ManAppendCi(p);
      local_b8[uVar2] = iVar1;
    }
    iVar1 = Gia_ManAppendXor(p,local_b8[0],local_b8[1]);
    local_78[0] = Gia_ManAppendXor(p,iVar1,local_b8[2]);
    iVar1 = Gia_ManAppendOr(p,local_b8[1],local_b8[2]);
    iVar1 = Gia_ManAppendAnd(p,local_b8[0],iVar1);
    iLit1 = Gia_ManAppendAnd(p,local_b8[1],local_b8[2]);
    local_78[1] = Gia_ManAppendOr(p,iVar1,iLit1);
    uVar4 = 0;
    if (nOuts < 1) {
      nOuts = uVar4;
    }
    if (nBoxes < 1) {
      nBoxes = 0;
    }
    for (; uVar4 != nBoxes; uVar4 = uVar4 + 1) {
      for (uVar3 = 0; (uint)nOuts != uVar3; uVar3 = uVar3 + 1) {
        Gia_ManAppendCo(p,local_78[uVar3]);
      }
    }
    return p;
  }
  __assert_fail("nIns < 16 && nOuts < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                ,0x2b5,"Gia_Man_t *Gia_ManGenerateExtraAig(int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManGenerateExtraAig( int nBoxes, int nIns, int nOuts )
{
    Gia_Man_t * pNew = Gia_ManStart( nBoxes * 20 );
    int i, k, pInLits[16], pOutLits[16];
    assert( nIns < 16 && nOuts < 16 );
    for ( i = 0; i < nIns; i++ )
        pInLits[i] = Gia_ManAppendCi( pNew );
    pOutLits[0] = Gia_ManAppendXor( pNew, Gia_ManAppendXor(pNew, pInLits[0], pInLits[1]), pInLits[2] );
    pOutLits[1] = Gia_ManAppendMaj( pNew, pInLits[0], pInLits[1], pInLits[2] );
    for ( i = 0; i < nBoxes; i++ )
        for ( k = 0; k < nOuts; k++ )
            Gia_ManAppendCo( pNew, pOutLits[k] );
    return pNew;
}